

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

FP32 anon_unknown.dwarf_13fc48::half_to_float(FP16 h)

{
  uint uVar1;
  uint exp_;
  FP16 h_local;
  FP32 o;
  
  uVar1 = ((uint)h & 0x7fff) * 0x2000;
  exp_ = uVar1 + 0x38000000;
  if ((uVar1 & 0xf800000) == 0xf800000) {
    exp_ = uVar1 + 0x70000000;
  }
  else if ((uVar1 & 0xf800000) == 0) {
    exp_ = (uint)((float)(uVar1 + 0x38800000) - 6.1035156e-05);
  }
  return (FP32)(((uint)h & 0x8000) << 0x10 | exp_);
}

Assistant:

FP32 half_to_float(FP16 h) {
  static const FP32 magic = {113 << 23};
  static const unsigned int shifted_exp = 0x7c00
                                          << 13; // exponent mask after shift
  FP32 o;

  o.u = (h.u & 0x7fff) << 13;            // exponent/mantissa bits
  unsigned int exp_ = shifted_exp & o.u; // just the exponent
  o.u += (127 - 15) << 23;               // exponent adjust

  // handle exponent special cases
  if (exp_ == shifted_exp)   // Inf/NaN?
    o.u += (128 - 16) << 23; // extra exp adjust
  else if (exp_ == 0)        // Zero/Denormal?
  {
    o.u += 1 << 23; // extra exp adjust
    o.f -= magic.f; // renormalize
  }

  o.u |= (h.u & 0x8000) << 16; // sign bit
  return o;
}